

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * declarator(dmr_C *C,token *token,decl_state *ctx)

{
  byte *pbVar1;
  uchar uVar2;
  _func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *p_Var3;
  global_symbols_t *pgVar4;
  symbol *psVar5;
  anon_union_136_3_e2189aaa_for_symbol_15 *paVar6;
  decl_state *pdVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  symbol *psVar11;
  char *pcVar12;
  token *ptVar13;
  anon_union_8_7_c7bfca54_for_token_2 *paVar14;
  uint uVar15;
  position pVar16;
  dmr_C *C_00;
  decl_state *pdVar17;
  undefined4 uStack_88;
  undefined4 uStack_84;
  expression *expr;
  undefined4 local_78;
  undefined4 uStack_74;
  uint uStack_70;
  undefined4 uStack_6c;
  symbol *local_68;
  ident **ppiStack_60;
  symbol_op *local_58;
  uchar uStack_50;
  uchar uStack_4f;
  byte bStack_4e;
  uchar uStack_4d;
  undefined4 uStack_4c;
  int local_44;
  anon_union_8_7_c7bfca54_for_token_2 *local_40;
  symbol *local_38;
  
  pVar16 = token->pos;
  if ((pVar16._0_4_ & 0x3f) == 0x11) {
    do {
      if ((token->field_2).special != 0x2a) break;
      psVar11 = dmrC_alloc_symbol(C->S,pVar16,4);
      (psVar11->field_14).field_2.ctype.modifiers = (ctx->ctype).modifiers;
      (psVar11->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
      *(uint *)((long)&psVar11->field_14 + 0x30) = (ctx->ctype).as;
      (psVar11->field_14).field_2.ctype.contexts = (ctx->ctype).contexts;
      (ctx->ctype).modifiers = 0;
      (ctx->ctype).base_type = psVar11;
      (ctx->ctype).alignment = 0;
      (ctx->ctype).contexts = (context_list *)0x0;
      (ctx->ctype).as = 0;
      token = token->next;
      do {
        if (((ulong)token->pos & 0x3f) != 2) break;
        psVar11 = dmrC_lookup_symbol((token->field_2).ident,NS_TYPEDEF);
        if (((psVar11 == (symbol *)0x0) || (*(char *)psVar11 != '\x11')) ||
           ((psVar11->op->type & (KW_ATTRIBUTE|KW_QUALIFIER)) == 0)) {
          bVar8 = false;
        }
        else {
          token = token->next;
          p_Var3 = psVar11->op->declarator;
          bVar8 = true;
          if (p_Var3 != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
            token = (*p_Var3)(C,token,ctx);
          }
        }
      } while (bVar8);
      ((ctx->ctype).base_type)->endpos = token->pos;
      pVar16 = token->pos;
    } while ((pVar16._0_4_ & 0x3f) == 0x11);
  }
  paVar14 = (anon_union_8_7_c7bfca54_for_token_2 *)ctx->ident;
  pdVar17 = ctx;
  if ((paVar14 != (anon_union_8_7_c7bfca54_for_token_2 *)0x0) && (((ulong)token->pos & 0x3f) == 2))
  {
    *paVar14 = token->field_2;
    token = token->next;
    goto LAB_001188e2;
  }
  if ((((ulong)token->pos & 0x3f) != 0x11) || ((token->field_2).special != 0x28)) goto LAB_001188e2;
  uVar2 = ctx->prefer_abstract;
  local_40 = paVar14;
  ptVar13 = skip_attributes(C,token->next);
  uVar9 = SUB84(ptVar13->pos,0) & 0x3f;
  if (uVar9 == 0x11) {
    bVar8 = (ptVar13->field_2).special != 0x117 && (ptVar13->field_2).special != 0x29;
LAB_00118af5:
    paVar14 = local_40;
    if (!bVar8) goto LAB_001188e2;
  }
  else if ((uVar9 == 2) &&
          (psVar11 = dmrC_lookup_symbol((ptVar13->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
          psVar11 != (symbol *)0x0)) {
    bVar8 = uVar2 == '\0' || (psVar11->field_0x1 & 2) == 0;
    goto LAB_00118af5;
  }
  psVar11 = (ctx->ctype).base_type;
  if (token->next != ptVar13) {
    ptVar13 = handle_attributes(C,token->next,ctx,8);
  }
  ptVar13 = declarator(C,ptVar13,ctx);
  token = dmrC_expect_token(C,ptVar13,0x29,"in nested declarator");
  paVar14 = (anon_union_8_7_c7bfca54_for_token_2 *)0x0;
  pdVar7 = ctx;
  do {
    pdVar17 = pdVar7;
    psVar5 = (pdVar17->ctype).base_type;
    pdVar7 = (decl_state *)&(psVar5->field_14).field_2.ctype;
  } while (psVar5 != psVar11);
LAB_001188e2:
  if ((((ulong)token->pos & 0x3f) == 0x11) && ((token->field_2).special == 0x28)) {
    ptVar13 = token->next;
    uVar15 = SUB84(ptVar13->pos,0);
    uVar9 = uVar15 & 0x3f;
    if (uVar9 == 0x11) {
      if ((ptVar13->field_2).special == 0x117) {
        dmrC_warning(C,ptVar13->pos,"variadic functions must have one named argument");
        iVar10 = 2;
      }
      else {
        iVar10 = 3;
        if ((ptVar13->field_2).special == 0x29) {
          iVar10 = 0;
          if ((paVar14 != (anon_union_8_7_c7bfca54_for_token_2 *)0x0) &&
             ((((ulong)ptVar13->next->pos & 0x3f) != 0x11 ||
              (iVar10 = 0, (ptVar13->next->field_2).special != 0x3b)))) {
            pcVar12 = dmrC_show_ident(C,paVar14->ident);
            iVar10 = 0;
            dmrC_warning(C,ptVar13->pos,"non-ANSI function declaration of function \'%s\'",pcVar12);
          }
        }
      }
    }
    else {
      iVar10 = 3;
      if ((uVar9 == 2) &&
         ((((uVar2 = ctx->prefer_abstract, (uVar15 & 0x3f) != 2 ||
            (psVar11 = dmrC_lookup_symbol((ptVar13->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
            psVar11 == (symbol *)0x0)) || (iVar10 = 2, (psVar11->field_0x1 & 2) == 0)) &&
          (iVar10 = 1, uVar2 != '\0')))) {
        dmrC_warning(C,token->pos,"identifier list not in definition");
      }
    }
    local_38 = dmrC_alloc_symbol(C->S,token->pos,5);
    (local_38->field_14).field_2.ctype.base_type = (pdVar17->ctype).base_type;
    (local_38->field_14).field_2.ctype.modifiers = (pdVar17->ctype).modifiers;
    (pdVar17->ctype).base_type = local_38;
    (pdVar17->ctype).modifiers = 0;
    ptVar13 = token->next;
    if (iVar10 == 2) {
      local_40 = (anon_union_8_7_c7bfca54_for_token_2 *)((long)&local_38->field_14 + 0x40);
      do {
        if (((SUB84(ptVar13->pos,0) & 0x3f) == 0x11) && ((ptVar13->field_2).special == 0x117)) {
          pbVar1 = (byte *)((long)&local_38->field_14 + 0xe);
          *pbVar1 = *pbVar1 | 4;
          bVar8 = false;
LAB_00118df4:
          ptVar13 = ptVar13->next;
        }
        else {
          psVar11 = dmrC_alloc_symbol(C->S,ptVar13->pos,3);
          local_58 = (symbol_op *)0x0;
          local_68 = (symbol *)0x0;
          ppiStack_60 = (ident **)0x0;
          _local_78 = (context_list *)0x0;
          uStack_70 = 0;
          uStack_6c = 0;
          _uStack_88 = (expression *)0x0;
          expr = (expression *)0x0;
          uStack_50 = '\x01';
          uStack_4f = '\0';
          bStack_4e = '\0';
          uStack_4d = '\0';
          uStack_4c = 0;
          ptVar13 = declaration_specifiers(C,ptVar13,(decl_state *)&stack0xffffffffffffff78);
          ppiStack_60 = &psVar11->ident;
          ptVar13 = declarator(C,ptVar13,(decl_state *)&stack0xffffffffffffff78);
          ptVar13 = handle_attributes(C,ptVar13,(decl_state *)&stack0xffffffffffffff78,8);
          apply_modifiers(C,ptVar13->pos,(decl_state *)&stack0xffffffffffffff78);
          (psVar11->field_14).field_2.ctype.base_type = local_68;
          *(undefined4 *)((long)&psVar11->field_14 + 0x28) = local_78;
          *(undefined4 *)((long)&psVar11->field_14 + 0x2c) = uStack_74;
          *(uint *)((long)&psVar11->field_14 + 0x30) = uStack_70;
          *(undefined4 *)((long)&psVar11->field_14 + 0x34) = uStack_6c;
          *(undefined4 *)((long)&psVar11->field_14 + 0x18) = uStack_88;
          *(undefined4 *)((long)&psVar11->field_14 + 0x1c) = uStack_84;
          *(undefined4 *)((long)&psVar11->field_14 + 0x20) = expr._0_4_;
          *(undefined4 *)((long)&psVar11->field_14 + 0x24) = expr._4_4_;
          (psVar11->field_14).field_2.ctype.modifiers =
               (ulong)(uStack_4f != '\0') << 0x12 |
               *(ulong *)(storage_modifiers_mod + (ulong)bStack_4e * 8) |
               (psVar11->field_14).field_2.ctype.modifiers | (ulong)(uStack_4d != '\0') << 0x11;
          psVar11->endpos = ptVar13->pos;
          *(uint *)((long)&psVar11->field_14 + 0xc) =
               *(uint *)((long)&psVar11->field_14 + 0xc) & 0xfdffffff |
               (uint)(bStack_4e == 6) << 0x19;
          if ((psVar11->field_14).field_2.ctype.base_type == &C->S->void_ctype) {
            if ((local_40->number != (char *)0x0) || (psVar11->ident != (ident *)0x0)) {
              dmrC_warning(C,ptVar13->pos,"void parameter");
              goto LAB_00118dcd;
            }
          }
          else {
LAB_00118dcd:
            ptrlist_add((ptr_list **)&local_40->ident,psVar11,&C->ptrlist_allocator);
            if ((((ulong)ptVar13->pos & 0x3f) == 0x11) &&
               (bVar8 = true, (ptVar13->field_2).special == 0x2c)) goto LAB_00118df4;
          }
          bVar8 = false;
        }
      } while (bVar8);
    }
    else if (iVar10 == 1) {
      paVar6 = &local_38->field_14;
      do {
        psVar11 = dmrC_alloc_symbol(C->S,ptVar13->pos,3);
        psVar11->ident = (ident *)ptVar13->field_2;
        ptVar13 = ptVar13->next;
        psVar11->endpos = ptVar13->pos;
        (psVar11->field_14).field_2.ctype.base_type = &C->S->incomplete_ctype;
        ptrlist_add((ptr_list **)&(paVar6->field_2).arguments,psVar11,&C->ptrlist_allocator);
        if ((((((ulong)ptVar13->pos & 0x3f) == 0x11) && ((ptVar13->field_2).special == 0x2c)) &&
            (((ulong)ptVar13->next->pos & 0x3f) == 2)) &&
           ((psVar11 = dmrC_lookup_symbol((ptVar13->next->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
            psVar11 == (symbol *)0x0 || ((psVar11->field_0x1 & 2) == 0)))) {
          ptVar13 = ptVar13->next;
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (bVar8);
    }
    token = dmrC_expect_token(C,ptVar13,0x29,"in function declarator");
    local_38->endpos = token->pos;
  }
  else {
    pVar16 = token->pos;
    uVar9 = pVar16._0_4_;
    while (((uVar9 & 0x3f) == 0x11 && ((token->field_2).special == 0x5b))) {
      psVar11 = dmrC_alloc_symbol(C->S,pVar16,6);
      (psVar11->field_14).field_2.ctype.base_type = (pdVar17->ctype).base_type;
      (psVar11->field_14).field_2.ctype.modifiers = (pdVar17->ctype).modifiers;
      (pdVar17->ctype).base_type = psVar11;
      (pdVar17->ctype).modifiers = 0;
      _uStack_88 = (expression *)0x0;
      local_44 = 0;
      C_00 = C;
      ptVar13 = abstract_array_static_declarator(C,token->next,&local_44);
      pgVar4 = C->S;
      iVar10 = match_idents(C_00,ptVar13,pgVar4->restrict_ident,pgVar4->__restrict_ident,
                            pgVar4->__restrict___ident,0);
      if (iVar10 != 0) {
        ptVar13 = abstract_array_static_declarator(C,ptVar13->next,&local_44);
      }
      pdVar17 = (decl_state *)&(psVar11->field_14).field_2.ctype;
      ptVar13 = dmrC_parse_expression(C,ptVar13,(expression **)&stack0xffffffffffffff78);
      (psVar11->field_14).field_0.used_in = (scope *)_uStack_88;
      token = dmrC_expect_token(C,ptVar13,0x5d,"in abstract_array_declarator");
      psVar11->endpos = token->pos;
      pVar16 = token->pos;
      uVar9 = pVar16._0_4_;
    }
  }
  return token;
}

Assistant:

static struct token *declarator(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	token = pointer(C, token, ctx);
	return direct_declarator(C, token, ctx);
}